

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNStmCompBase::fold_constants(CTPNStmCompBase *this,CTcPrsSymtab *symtab)

{
  CTcTokenizer *this_00;
  CTcTokFileDesc *desc;
  long linenum;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  CTPNStm *cur;
  CTPNStmBase *local_18;
  
  for (local_18 = (CTPNStmBase *)in_RDI[6].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      this_00 = G_tok, local_18 != (CTPNStmBase *)0x0;
      local_18 = &CTPNStmBase::get_next_stm(local_18)->super_CTPNStmBase) {
    desc = CTPNStmBase::get_source_desc(local_18);
    linenum = CTPNStmBase::get_source_linenum(local_18);
    CTcTokenizer::set_line_info(this_00,desc,linenum);
    (*(local_18->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xf])(local_18,in_RSI);
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNStmCompBase::fold_constants(class CTcPrsSymtab *symtab)
{
    /* iterate through our statements and fold constants in each one */
    for (CTPNStm *cur = first_stm_ ; cur != 0 ; cur = cur->get_next_stm())
    {
        /* 
         *   set this statement's source line location to be the current
         *   location for error reporting 
         */
        G_tok->set_line_info(cur->get_source_desc(),
                             cur->get_source_linenum());

        /* 
         *   Fold constants, using the enclosing symbol table (not the
         *   local symbol table - during code generation we can resolve
         *   only to the global scope, since local scope symbols must
         *   always be resolved during parsing).  We assume that statement
         *   nodes are never replaced during constant folding, so we
         *   ignore the result of this call and keep our original
         *   statement list entry.  
         */
        cur->fold_constants(symtab);
    }

    /* 
     *   although nodes within our subtree might have been changed, this
     *   compound statement itself is unchanged by constant folding 
     */
    return this;
}